

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSerialize.cpp
# Opt level: O0

void __thiscall
TTD::TextFormatWriter::WriteInlinePropertyRecordName
          (TextFormatWriter *this,char16 *pname,uint32 length,Separator separator)

{
  undefined4 in_register_00000014;
  Separator separator_local;
  uint32 length_local;
  char16 *pname_local;
  TextFormatWriter *this_local;
  
  (*(this->super_FileWriter)._vptr_FileWriter[2])
            (this,(ulong)separator,CONCAT44(in_register_00000014,length),separator);
  FileWriter::WriteFormattedCharData<7ul,unsigned_int>
            (&this->super_FileWriter,(char16 (*) [7])L"@%I32u",length);
  FileWriter::WriteRawChar(&this->super_FileWriter,L'\"');
  FileWriter::WriteRawCharBuff(&this->super_FileWriter,pname,(ulong)length);
  FileWriter::WriteRawChar(&this->super_FileWriter,L'\"');
  return;
}

Assistant:

void TextFormatWriter::WriteInlinePropertyRecordName(_In_reads_(length) const char16* pname, uint32 length, NSTokens::Separator separator)
    {
        this->WriteSeparator(separator);

        this->WriteFormattedCharData(_u("@%I32u"), length);

        this->WriteRawChar(_u('\"'));
        this->WriteRawCharBuff(pname, length);
        this->WriteRawChar(_u('\"'));
    }